

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc_xmlmodelserialiser.cpp
# Opt level: O0

int __thiscall XmlModelSerialiser::qt_metacall(XmlModelSerialiser *this,Call _c,int _id,void **_a)

{
  void **_a_local;
  int _id_local;
  Call _c_local;
  XmlModelSerialiser *this_local;
  
  _a_local._0_4_ =
       AbstractStringSerialiser::qt_metacall(&this->super_AbstractStringSerialiser,_c,_id,_a);
  this_local._4_4_ = (int)_a_local;
  if (-1 < (int)_a_local) {
    if ((((_c == ReadProperty) || (_c == WriteProperty)) || (_c == ResetProperty)) ||
       ((_c == BindableProperty || (_c == RegisterPropertyMetaType)))) {
      qt_static_metacall((QObject *)this,_c,(int)_a_local,_a);
      _a_local._0_4_ = (int)_a_local + -1;
    }
    this_local._4_4_ = (int)_a_local;
  }
  return this_local._4_4_;
}

Assistant:

int XmlModelSerialiser::qt_metacall(QMetaObject::Call _c, int _id, void **_a)
{
    _id = AbstractStringSerialiser::qt_metacall(_c, _id, _a);
    if (_id < 0)
        return _id;
    
#ifndef QT_NO_PROPERTIES
    if (_c == QMetaObject::ReadProperty || _c == QMetaObject::WriteProperty
            || _c == QMetaObject::ResetProperty || _c == QMetaObject::BindableProperty
            || _c == QMetaObject::RegisterPropertyMetaType) {
        qt_static_metacall(this, _c, _id, _a);
        _id -= 1;
    }
#endif // QT_NO_PROPERTIES
    return _id;
}